

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

Error * ot::commissioner::CommissionerApp::Create
                  (Error *__return_storage_ptr__,
                  shared_ptr<ot::commissioner::CommissionerApp> *aCommApp,Config *aConfig)

{
  ErrorCode EVar1;
  CommissionerApp *this;
  shared_ptr<ot::commissioner::CommissionerApp> app;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  string *local_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  local_68 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_68;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_60 = &__return_storage_ptr__->mMessage;
  this = (CommissionerApp *)operator_new(0x368);
  memset(this,0,0x368);
  CommissionerApp(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ot::commissioner::CommissionerApp*>(&local_70,this);
  Init((Error *)local_58,this,aConfig);
  __return_storage_ptr__->mCode = local_58._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (EVar1 == kNone) {
    if ((aConfig->mCommissionerToken).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (aConfig->mCommissionerToken).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0x43])
                (local_58,this,&aConfig->mCommissionerToken);
      if (local_50._M_p != local_40) {
        operator_delete(local_50._M_p);
      }
    }
    (aCommApp->super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(aCommApp->
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,&local_70);
  }
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::Create(std::shared_ptr<CommissionerApp> &aCommApp, const Config &aConfig)
{
    Error error;
    auto  app = std::shared_ptr<CommissionerApp>(new CommissionerApp());

    SuccessOrExit(error = app->Init(aConfig));
    if (aConfig.mCommissionerToken.size() > 0)
    {
        app->SetToken(aConfig.mCommissionerToken).IgnoreError();
    }

    aCommApp = app;

exit:
    return error;
}